

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleShaderBuiltInTests.cpp
# Opt level: O1

int __thiscall
vkt::pipeline::multisample::MSCase<vkt::pipeline::multisample::MSCaseSampleID>::init
          (MSCase<vkt::pipeline::multisample::MSCaseSampleID> *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  int iVar1;
  EVP_PKEY_CTX *ctx_00;
  undefined1 local_190 [384];
  
  local_190._0_8_ =
       ((this->super_MSCaseBaseResolveAndPerSampleFetch).super_MultisampleCaseBase.super_TestCase.
        super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_190 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "Writing gl_SampleID to the red channel of the texture and verifying texture values.\n"
             ,0x54);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Expecting value N at sample index N of a multisample texture.\n",
             0x3e);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  ctx_00 = (EVP_PKEY_CTX *)&std::__cxx11::ostringstream::VTT;
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x78));
  iVar1 = tcu::TestNode::init((TestNode *)this,ctx_00);
  return iVar1;
}

Assistant:

void MSCase<MSCaseSampleID>::init (void)
{
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Writing gl_SampleID to the red channel of the texture and verifying texture values.\n"
		<< "Expecting value N at sample index N of a multisample texture.\n"
		<< tcu::TestLog::EndMessage;

	MultisampleCaseBase::init();
}